

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O3

Vec_Ptr_t * Nwk_ManRetimeCutForward(Nwk_Man_t *pMan,int nLatches,int fVerbose)

{
  uint *puVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pMan->nLatches = nLatches;
  iVar3 = pMan->nObjs[1] - nLatches;
  pMan->nTruePis = iVar3;
  pMan->nTruePos = pMan->nObjs[2] - nLatches;
  pVVar7 = pMan->vCos;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      puVar1 = (uint *)((long)pVVar7->pArray[lVar10] + 0x20);
      *puVar1 = *puVar1 | 0x10;
      lVar10 = lVar10 + 1;
      pVVar7 = pMan->vCos;
    } while (lVar10 < pVVar7->nSize);
    iVar3 = pMan->nTruePis;
  }
  if (0 < iVar3) {
    lVar10 = 0;
    do {
      if (pMan->vCis->nSize <= lVar10) goto LAB_008ea1b4;
      Nwk_ManMarkTfoCone_rec((Nwk_Obj_t *)pMan->vCis->pArray[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < pMan->nTruePis);
  }
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  if (pMan->nLatches < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    iVar13 = 0;
    do {
      uVar4 = pMan->nTruePis + iVar13;
      if (((int)uVar4 < 0) || (pMan->vCis->nSize <= (int)uVar4)) goto LAB_008ea1b4;
      iVar5 = Nwk_ManPushForwardFast_rec((Nwk_Obj_t *)pMan->vCis->pArray[uVar4],(Nwk_Obj_t *)0x0);
      if (iVar5 != 0) {
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        iVar3 = iVar3 + 1;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < pMan->nLatches);
  }
  if (fVerbose != 0) {
    printf("Forward:  Max-flow = %4d -> ");
  }
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  Nwk_ManIncrementTravId(pMan);
  if (pMan->nLatches < 1) {
    iVar13 = 0;
  }
  else {
    iVar13 = 0;
    iVar5 = 0;
    do {
      uVar4 = pMan->nTruePis + iVar5;
      if (((int)uVar4 < 0) || (pMan->vCis->nSize <= (int)uVar4)) goto LAB_008ea1b4;
      iVar6 = Nwk_ManPushForwardBot_rec((Nwk_Obj_t *)pMan->vCis->pArray[uVar4],(Nwk_Obj_t *)0x0);
      if (iVar6 != 0) {
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        Nwk_ManIncrementTravId(pMan);
        iVar13 = iVar13 + 1;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < pMan->nLatches);
  }
  if (fVerbose != 0) {
    printf("%4d.  ");
  }
  if (0 < iVar13) {
    Nwk_ManIncrementTravId(pMan);
    Nwk_ManIncrementTravId(pMan);
    Nwk_ManIncrementTravId(pMan);
    if (0 < pMan->nLatches) {
      iVar5 = 0;
      do {
        uVar4 = pMan->nTruePis + iVar5;
        if (((int)uVar4 < 0) || (pMan->vCis->nSize <= (int)uVar4)) {
LAB_008ea1b4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar6 = Nwk_ManPushForwardBot_rec((Nwk_Obj_t *)pMan->vCis->pArray[uVar4],(Nwk_Obj_t *)0x0);
        if (iVar6 != 0) {
          __assert_fail("!RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                        ,0x1e6,"Vec_Ptr_t *Nwk_ManRetimeCutForward(Nwk_Man_t *, int, int)");
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < pMan->nLatches);
    }
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  uVar15 = 8;
  if (6 < (iVar13 + iVar3) - 1U) {
    uVar15 = (ulong)(uint)(iVar13 + iVar3);
  }
  pVVar7->nSize = 0;
  iVar3 = (int)uVar15;
  pVVar7->nCap = iVar3;
  uVar4 = 0;
  if (iVar3 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar3 << 3);
  }
  pVVar7->pArray = ppvVar8;
  pVVar9 = pMan->vObjs;
  uVar16 = 0;
  if (0 < pVVar9->nSize) {
    uVar4 = 0;
    lVar10 = 0;
    uVar16 = 0;
    do {
      plVar2 = (long *)pVVar9->pArray[lVar10];
      if ((plVar2 != (long *)0x0) && (*(int *)(*plVar2 + 0x68) + -2 == (int)plVar2[5])) {
        if ((*(uint *)(plVar2 + 4) & 0x20) == 0) {
          __assert_fail("Nwk_ObjHasFlow(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                        ,0x1f0,"Vec_Ptr_t *Nwk_ManRetimeCutForward(Nwk_Man_t *, int, int)");
        }
        if ((*(uint *)(plVar2 + 4) & 7) == 2) {
          __assert_fail("!Nwk_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                        ,0x1f1,"Vec_Ptr_t *Nwk_ManRetimeCutForward(Nwk_Man_t *, int, int)");
        }
        uVar14 = (uint)uVar15;
        if (uVar4 == uVar14) {
          if ((int)uVar14 < 0x10) {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
            }
            pVVar7->pArray = ppvVar8;
            pVVar7->nCap = 0x10;
            uVar15 = 0x10;
          }
          else {
            uVar15 = (ulong)(uVar14 * 2);
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(uVar15 * 8);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar7->pArray,uVar15 * 8);
            }
            pVVar7->pArray = ppvVar8;
            pVVar7->nCap = uVar14 * 2;
          }
        }
        else {
          ppvVar8 = pVVar7->pArray;
        }
        lVar11 = (long)(int)uVar4;
        uVar4 = uVar4 + 1;
        pVVar7->nSize = uVar4;
        ppvVar8[lVar11] = plVar2;
        uVar16 = uVar16 + ((*(uint *)(plVar2 + 4) & 7) == 1);
        pVVar9 = pMan->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar9->nSize);
  }
  Nwk_ManCleanMarks(pMan);
  if (fVerbose != 0) {
    iVar3 = 0xa815e0;
    printf("Min-cut = %4d.  Unmoved = %4d. ",(ulong)uVar4,(ulong)uVar16);
    Abc_Print(iVar3,"%s =","Time");
    iVar13 = 3;
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(iVar13,"%9.2f sec\n",(double)(lVar10 + lVar12) / 1000000.0);
  }
  return pVVar7;
}

Assistant:

Vec_Ptr_t * Nwk_ManRetimeCutForward( Nwk_Man_t * pMan, int nLatches, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Nwk_Obj_t * pObj;
    int i, RetValue, Counter = 0, Counter2 = 0;
    abctime clk = Abc_Clock();
    // set the sequential parameters
    pMan->nLatches = nLatches;
    pMan->nTruePis = Nwk_ManCiNum(pMan) - nLatches;
    pMan->nTruePos = Nwk_ManCoNum(pMan) - nLatches;
    // mark the COs and the TFO of PIs
    Nwk_ManForEachCo( pMan, pObj, i )
        pObj->MarkA = 1;
    Nwk_ManForEachPiSeq( pMan, pObj, i )
        Nwk_ManMarkTfoCone_rec( pObj );
    // start flow computation from each LO
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLoSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushForwardFast_rec( pObj, NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter++;
    }
    if ( fVerbose )
    printf( "Forward:  Max-flow = %4d -> ", Counter );
    // continue flow computation from each LO
    Nwk_ManIncrementTravIdFlow( pMan );
    Nwk_ManForEachLoSeq( pMan, pObj, i )
    {
        if ( !Nwk_ManPushForwardBot_rec( pObj, NULL ) )
            continue;
        Nwk_ManIncrementTravIdFlow( pMan );
        Counter2++;
    }
    if ( fVerbose )
    printf( "%4d.  ", Counter+Counter2 );
    // repeat flow computation from each LO
    if ( Counter2 > 0 )
    {
        Nwk_ManIncrementTravIdFlow( pMan );
        Nwk_ManForEachLoSeq( pMan, pObj, i )
        {
            RetValue = Nwk_ManPushForwardBot_rec( pObj, NULL );
            assert( !RetValue );
        }
    }
    // cut is a set of nodes whose bottom is visited but top is not visited
    vNodes = Vec_PtrAlloc( Counter+Counter2 );
    Counter = 0;
    Nwk_ManForEachObj( pMan, pObj, i )
    {
        if ( Nwk_ObjVisitedBotOnly(pObj) )
        {
            assert( Nwk_ObjHasFlow(pObj) );
            assert( !Nwk_ObjIsCo(pObj) );
            Vec_PtrPush( vNodes, pObj );
            Counter += Nwk_ObjIsCi(pObj);
        }
    }
    Nwk_ManCleanMarks( pMan );
//    assert( Nwk_ManRetimeVerifyCutForward(pMan, vNodes) );
    if ( fVerbose )
    {
    printf( "Min-cut = %4d.  Unmoved = %4d. ", Vec_PtrSize(vNodes), Counter );
    ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vNodes;
}